

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

int query_int(char *prompt,int minimum,int maximum)

{
  int iVar1;
  char *pcVar2;
  int local_41c;
  int scanf_res;
  int res;
  char str [1024];
  int maximum_local;
  int minimum_local;
  char *prompt_local;
  
  str._1016_4_ = maximum;
  str._1020_4_ = minimum;
  while( true ) {
    while( true ) {
      local_41c = 0;
      printf("%s",prompt);
      pcVar2 = fgets((char *)&scanf_res,0x400,_stdin);
      if (pcVar2 == (char *)0x0) {
        exit(1);
      }
      iVar1 = __isoc99_sscanf(&scanf_res,"%d",&local_41c);
      if (iVar1 == 1) break;
      printf("Invalid number entered!\n");
      __isoc99_scanf("%*[^\n]");
    }
    if (((int)str._1020_4_ <= local_41c) && (local_41c <= (int)str._1016_4_)) break;
    printf("Invalid number entered!\n");
  }
  return local_41c;
}

Assistant:

int query_int(const char* prompt, const int minimum, const int maximum) {
  while (true) {
    char str[1024];
    int res = 0;

    printf("%s", prompt);

    if (!fgets(str, 1024, stdin)) exit(1);

    const int scanf_res = sscanf(str, "%d", &res);

    if (scanf_res != 1) {
      printf("Invalid number entered!\n");
      scanf("%*[^\n]");
    } else if (res < minimum || res > maximum) {
      printf("Invalid number entered!\n");
    } else {
      return res;
    }
  }
}